

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O0

void __thiscall umu::r3::r3(r3 *this)

{
  string *in_RDI;
  _union_map_union_Union__0__ *in_stack_00000010;
  
  std::__cxx11::string::string(in_RDI);
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2d0d6c);
  _union_map_union_Union__0__::_union_map_union_Union__0__(in_stack_00000010);
  return;
}

Assistant:

r3() :
        name(std::string()),
        data(std::vector<uint8_t>()),
        rev(_union_map_union_Union__0__())
        { }